

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int evp_keyex_init(ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx,
                  EVP_PKEY *pkey)

{
  ptls_key_exchange_context_t *ppVar1;
  size_t sVar2;
  int iVar3;
  
  ppVar1 = (ptls_key_exchange_context_t *)malloc(0x28);
  iVar3 = 0x201;
  if (ppVar1 != (ptls_key_exchange_context_t *)0x0) {
    ppVar1->algo = algo;
    (ppVar1->pubkey).base = (uint8_t *)0x0;
    (ppVar1->pubkey).len = 0;
    ppVar1->on_exchange = evp_keyex_on_exchange;
    ppVar1[1].algo = (st_ptls_key_exchange_algorithm_t *)pkey;
    sVar2 = EVP_PKEY_get1_encoded_public_key(pkey,&ppVar1->pubkey);
    (ppVar1->pubkey).len = sVar2;
    if (sVar2 == 0) {
      (ppVar1->pubkey).base = (uint8_t *)0x0;
    }
    else {
      *_ctx = ppVar1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int evp_keyex_init(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx, EVP_PKEY *pkey)
{
    struct st_evp_keyex_context_t *ctx = NULL;
    int ret;

    /* instantiate */
    if ((ctx = malloc(sizeof(*ctx))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    *ctx = (struct st_evp_keyex_context_t){{algo, {NULL}, evp_keyex_on_exchange}, pkey};

    /* set public key */
    if ((ctx->super.pubkey.len = EVP_PKEY_get1_tls_encodedpoint(ctx->privkey, &ctx->super.pubkey.base)) == 0) {
        ctx->super.pubkey.base = NULL;
        return PTLS_ERROR_NO_MEMORY;
    }

    *_ctx = &ctx->super;
    ret = 0;
Exit:
    if (ret != 0 && ctx != NULL)
        evp_keyex_free(ctx);
    return ret;
}